

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardDimensionSpecifierSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token star;
  WildcardDimensionSpecifierSyntax *this_00;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (WildcardDimensionSpecifierSyntax *)allocate(this,0x20,8);
  star.kind = args->kind;
  star._2_1_ = args->field_0x2;
  star.numFlags.raw = (args->numFlags).raw;
  star.rawLen = args->rawLen;
  star.info = args->info;
  slang::syntax::WildcardDimensionSpecifierSyntax::WildcardDimensionSpecifierSyntax(this_00,star);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }